

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O1

bool illegalIpxStoppedCrossoverStatus(Info *ipx_info,HighsOptions *options)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  iVar1 = (ipx_info->super_ipx_info).status_crossover;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"stopped status_crossover should not be IPX_STATUS_optimal","");
  if (iVar1 == 1) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_48[0]);
    fflush((FILE *)0x0);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  bVar3 = true;
  if (iVar1 != 1) {
    iVar2 = (ipx_info->super_ipx_info).status_crossover;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"stopped status_crossover should not be IPX_STATUS_imprecise","");
    bVar3 = iVar2 == 2;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_68[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((iVar1 != 1) && (local_68[0] != local_58)) {
    operator_delete(local_68[0]);
  }
  bVar4 = true;
  if (!bVar3) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"stopped status_crossover should not be IPX_STATUS_primal_infeas",
               "");
    bVar4 = iVar1 == 3;
    if (bVar4) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_88[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar3) && (local_88[0] != local_78)) {
    operator_delete(local_88[0]);
  }
  bVar3 = true;
  if (!bVar4) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"stopped status_crossover should not be IPX_STATUS_dual_infeas",""
              );
    bVar3 = iVar1 == 4;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_a8[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar4) && (local_a8[0] != local_98)) {
    operator_delete(local_a8[0]);
  }
  bVar4 = true;
  if (!bVar3) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"stopped status_crossover should not be IPX_STATUS_iter_limit","")
    ;
    bVar4 = iVar1 == 7;
    if (bVar4) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_c8[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar3) && (local_c8[0] != local_b8)) {
    operator_delete(local_c8[0]);
  }
  bVar3 = true;
  if (!bVar4) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,"stopped status_crossover should not be IPX_STATUS_no_progress",""
              );
    bVar3 = iVar1 == 8;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_e8[0]);
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar4) && (local_e8[0] != local_d8)) {
    operator_delete(local_e8[0]);
  }
  bVar4 = true;
  if (!bVar3) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"stopped status_crossover should not be IPX_STATUS_failed","");
    bVar4 = iVar1 == 9;
    if (bVar4) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_108[0])
      ;
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar3) && (local_108[0] != local_f8)) {
    operator_delete(local_108[0]);
  }
  bVar3 = true;
  if (!bVar4) {
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"stopped status_crossover should not be IPX_STATUS_debug","");
    bVar3 = iVar1 == 10;
    if (bVar3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_128[0])
      ;
      fflush((FILE *)0x0);
    }
  }
  if ((!bVar4) && (local_128[0] != local_118)) {
    operator_delete(local_128[0]);
  }
  return bVar3;
}

Assistant:

bool illegalIpxStoppedCrossoverStatus(const ipx::Info& ipx_info,
                                      const HighsOptions& options) {
  bool found_illegal_status = false;
  // Cannot stop and be optimal
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_optimal, options,
          "stopped status_crossover should not be IPX_STATUS_optimal");
  // Cannot stop and be imprecise
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_imprecise, options,
          "stopped status_crossover should not be IPX_STATUS_imprecise");
  // Cannot stop with primal infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_primal_infeas, options,
          "stopped status_crossover should not be IPX_STATUS_primal_infeas");
  // Cannot stop with dual infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_dual_infeas, options,
          "stopped status_crossover should not be IPX_STATUS_dual_infeas");
  // Cannot stop and reach iteration limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_iter_limit, options,
          "stopped status_crossover should not be IPX_STATUS_iter_limit");
  // Can stop and reach time limit
  // Cannot stop with no_progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_no_progress, options,
          "stopped status_crossover should not be IPX_STATUS_no_progress");
  // Cannot stop and failed - should be error return earlier
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_failed, options,
          "stopped status_crossover should not be IPX_STATUS_failed");
  // Cannot stop and debug - should be error return earlier
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_crossover == IPX_STATUS_debug, options,
                     "stopped status_crossover should not be IPX_STATUS_debug");
  return found_illegal_status;
}